

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void fs_listdir_fileinfo(char *dir,FS_LISTDIR_CALLBACK_FILEINFO cb,int type,void *user)

{
  uint uVar1;
  int iVar2;
  DIR *__dirp;
  size_t sVar3;
  dirent *pdVar4;
  char *src;
  long in_FS_OFFSET;
  CFsFileInfo info;
  time_t modified;
  time_t created;
  char buffer [512];
  CFsFileInfo local_260;
  time_t local_248;
  time_t local_240;
  char local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_240 = -1;
  local_248 = -1;
  __dirp = opendir(dir);
  if (__dirp != (DIR *)0x0) {
    str_format(local_238,0x200,"%s/",dir);
    sVar3 = strlen(local_238);
    do {
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) break;
      src = pdVar4->d_name;
      str_copy(local_238 + (int)sVar3,src,0x200 - (int)sVar3);
      fs_file_time(local_238,&local_240,&local_248);
      local_260.m_TimeCreated = local_240;
      local_260.m_TimeModified = local_248;
      local_260.m_pName = src;
      if (pdVar4->d_type == '\0') {
        uVar1 = fs_is_dir(local_238);
      }
      else {
        uVar1 = (uint)(pdVar4->d_type == '\x04');
      }
      iVar2 = (*cb)(&local_260,uVar1,type,user);
    } while (iVar2 == 0);
    closedir(__dirp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void fs_listdir_fileinfo(const char *dir, FS_LISTDIR_CALLBACK_FILEINFO cb, int type, void *user)
{
#if defined(CONF_FAMILY_WINDOWS)
	WIN32_FIND_DATAW finddata;
	HANDLE handle;
	char buffer[IO_MAX_PATH_LENGTH];
	char buffer2[IO_MAX_PATH_LENGTH];
	WCHAR wBuffer[IO_MAX_PATH_LENGTH];
	int length;

	str_format(buffer, sizeof(buffer), "%s/*", dir);
	MultiByteToWideChar(CP_UTF8, 0, buffer, -1, wBuffer, sizeof(wBuffer) / sizeof(WCHAR));

	handle = FindFirstFileW(wBuffer, &finddata);
	if(handle == INVALID_HANDLE_VALUE)
		return;

	str_format(buffer, sizeof(buffer), "%s/", dir);
	length = str_length(buffer);

	/* add all the entries */
	do
	{
		WideCharToMultiByte(CP_UTF8, 0, finddata.cFileName, -1, buffer2, sizeof(buffer2), NULL, NULL);
		str_copy(buffer+length, buffer2, (int)sizeof(buffer)-length);

		CFsFileInfo info;
		info.m_pName = buffer2;
		info.m_TimeCreated = filetime_to_unixtime(&finddata.ftCreationTime);
		info.m_TimeModified = filetime_to_unixtime(&finddata.ftLastWriteTime);

		if(cb(&info, (finddata.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0, type, user))
			break;
	}
	while(FindNextFileW(handle, &finddata));

	FindClose(handle);
#else
	struct dirent *entry;
	time_t created = -1, modified = -1;
	char buffer[IO_MAX_PATH_LENGTH];
	int length;
	DIR *d = opendir(dir);

	if(!d)
		return;

	str_format(buffer, sizeof(buffer), "%s/", dir);
	length = str_length(buffer);

	while((entry = readdir(d)) != NULL)
	{
		CFsFileInfo info;

		str_copy(buffer+length, entry->d_name, (int)sizeof(buffer)-length);
		fs_file_time(buffer, &created, &modified);

		info.m_pName = entry->d_name;
		info.m_TimeCreated = created;
		info.m_TimeModified = modified;

		if(cb(&info, entry->d_type == DT_UNKNOWN ? fs_is_dir(buffer) : entry->d_type == DT_DIR, type, user))
			break;
	}

	/* close the directory and return */
	closedir(d);
#endif
}